

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::visit_int64
          (basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
          int64_t value,semantic_tag tag,ser_context *context,error_code *ec)

{
  char in_DL;
  undefined7 in_stack_00000020;
  int64_t in_stack_000000f8;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_00000100;
  undefined7 in_stack_ffffffffffffffd0;
  
  if (in_DL == '\x05') {
    write_tag((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
              CONCAT17(tag,in_stack_00000020),(uint64_t)context);
  }
  else if (in_DL == '\x06' || in_DL == '\a') {
    visit_double(this,(double)value,tag,context,ec);
  }
  write_int64_value(in_stack_00000100,in_stack_000000f8);
  end_value((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
            CONCAT17(in_DL,in_stack_ffffffffffffffd0));
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_int64(int64_t value, 
                        semantic_tag tag, 
                        const ser_context& context,
                        std::error_code& ec) override
    {
        switch (tag)
        {
            case semantic_tag::epoch_milli:
            case semantic_tag::epoch_nano:
                visit_double(static_cast<double>(value), tag, context, ec);
                break;
            case semantic_tag::epoch_second:
                write_tag(1);
                break;
            default:
                break;
        }
        write_int64_value(value);
        end_value();
        JSONCONS_VISITOR_RETURN;
    }